

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall
gmath::PinholeCamera::reconstructPoint(PinholeCamera *this,Vector3d *Pw,Vector2d *p,double d)

{
  IOException *this_00;
  Vector3d Pc;
  SVector<double,_3> local_58;
  SVector<double,_3> local_40;
  
  if ((this->rho == 0.0) && (!NAN(this->rho))) {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&Pc,"Cannot reconstruct point with unknown rho",(allocator *)&local_58);
    gutil::IOException::IOException(this_00,(string *)&Pc);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  SVector<double,_3>::SVector(&Pc);
  reconstructLocal(this,&Pc,p);
  SVector<double,_3>::operator*=(&Pc,this->rho / d);
  SMatrix<double,_3,_3>::operator*(&local_40,&(this->super_Camera).R,&Pc);
  SVector<double,_3>::operator+(&local_58,&local_40,&(this->super_Camera).T);
  SVector<double,_3>::operator=(Pw,&local_58);
  return;
}

Assistant:

void PinholeCamera::reconstructPoint(Vector3d &Pw, const Vector2d &p, double d)
const
{
  if (rho == 0)
  {
    throw gutil::IOException("Cannot reconstruct point with unknown rho");
  }

  assert(std::isfinite(d));

  Vector3d Pc;
  reconstructLocal(Pc, p);

  Pc*=rho/d;

  Pw=getR()*Pc+getT();
}